

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_> *
__thiscall Json::OurReader::getStructuredErrors(OurReader *this)

{
  bool bVar1;
  vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  *in_RSI;
  value_type *in_RDI;
  StructuredError structured;
  ErrorInfo *error;
  const_iterator __end1;
  const_iterator __begin1;
  Errors *__range1;
  vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  *allErrors;
  _Self *in_stack_ffffffffffffff38;
  value_type *__x;
  string local_88 [32];
  reference local_68;
  _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
  local_40;
  pointer *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __x = in_RDI;
  std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>::
  vector((vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
          *)0x1ef6de);
  local_20 = &in_RSI[3].
              super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
             in_stack_ffffffffffffff38);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
            ((deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *)
             in_stack_ffffffffffffff38);
  while (bVar1 = std::operator!=((_Self *)in_RDI,in_stack_ffffffffffffff38), bVar1) {
    local_68 = std::
               _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
               ::operator*(&local_40);
    StructuredError::StructuredError((StructuredError *)0x1ef74d);
    std::__cxx11::string::operator=(local_88,(string *)&local_68->message_);
    std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
    ::push_back(in_RSI,__x);
    StructuredError::~StructuredError((StructuredError *)0x1ef7b2);
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                  *)in_RDI);
  }
  return (vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
          *)__x;
}

Assistant:

std::vector<OurReader::StructuredError> OurReader::getStructuredErrors() const {
  std::vector<OurReader::StructuredError> allErrors;
  for (const auto& error : errors_) {
    OurReader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}